

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  DBIter *this;
  size_t sVar1;
  uint uVar2;
  
  this = (DBIter *)operator_new(0xa8);
  Iterator::Iterator((Iterator *)this);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__DBIter_0016b708;
  this->db_ = db;
  this->user_comparator_ = user_key_comparator;
  this->iter_ = internal_iter;
  this->sequence_ = sequence;
  (this->status_).state_ = (char *)0x0;
  (this->saved_key_)._M_dataplus._M_p = (pointer)&(this->saved_key_).field_2;
  (this->saved_key_)._M_string_length = 0;
  (this->saved_key_).field_2._M_local_buf[0] = '\0';
  (this->saved_value_)._M_dataplus._M_p = (pointer)&(this->saved_value_).field_2;
  (this->saved_value_)._M_string_length = 0;
  (this->saved_value_).field_2._M_local_buf[0] = '\0';
  this->direction_ = kForward;
  this->valid_ = false;
  uVar2 = seed & 0x7fffffff;
  (this->rnd_).seed_ = uVar2;
  if ((uVar2 == 0x7fffffff) || (uVar2 == 0)) {
    (this->rnd_).seed_ = 1;
  }
  sVar1 = anon_unknown_3::DBIter::RandomCompactionPeriod(this);
  this->bytes_until_read_sampling_ = sVar1;
  return &this->super_Iterator;
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}